

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTransform.h
# Opt level: O0

ChVector<double> *
chrono::ChTransform<double>::TransformParentToLocal
          (ChVector<double> *__return_storage_ptr__,ChVector<double> *parent,
          ChVector<double> *origin,ChMatrix33<double> *alignment)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  CoeffReturnType pdVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double mz;
  double my;
  double mx;
  ChMatrix33<double> *alignment_local;
  ChVector<double> *origin_local;
  ChVector<double> *parent_local;
  
  pdVar5 = ChVector<double>::x(parent);
  dVar1 = *pdVar5;
  pdVar5 = ChVector<double>::x(origin);
  dVar1 = dVar1 - *pdVar5;
  pdVar5 = ChVector<double>::y(parent);
  dVar2 = *pdVar5;
  pdVar5 = ChVector<double>::y(origin);
  dVar2 = dVar2 - *pdVar5;
  pdVar5 = ChVector<double>::z(parent);
  dVar3 = *pdVar5;
  pdVar5 = ChVector<double>::z(origin);
  dVar3 = dVar3 - *pdVar5;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)alignment,0,0);
  dVar4 = *pdVar6;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)alignment,1,0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar4;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *pdVar6 * dVar2;
  auVar7 = vfmadd213sd_fma(auVar7,auVar12,auVar17);
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)alignment,2,0);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar7._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *pdVar6;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar3;
  auVar7 = vfmadd213sd_fma(auVar8,auVar13,auVar18);
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)alignment,0,1);
  dVar4 = *pdVar6;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)alignment,1,1);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar4;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *pdVar6 * dVar2;
  auVar8 = vfmadd213sd_fma(auVar9,auVar14,auVar19);
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)alignment,2,1);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar8._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *pdVar6;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar3;
  auVar8 = vfmadd213sd_fma(auVar10,auVar15,auVar20);
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)alignment,0,2);
  dVar4 = *pdVar6;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)alignment,1,2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar4;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *pdVar6 * dVar2;
  auVar9 = vfmadd213sd_fma(auVar11,auVar16,auVar21);
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)alignment,2,2);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = auVar9._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *pdVar6;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar3;
  auVar9 = vfmadd213sd_fma(auVar22,auVar23,auVar24);
  ChVector<double>::ChVector(__return_storage_ptr__,auVar7._0_8_,auVar8._0_8_,auVar9._0_8_);
  return __return_storage_ptr__;
}

Assistant:

static ChVector<Real> TransformParentToLocal(
        const ChVector<Real>& parent,  ///< point to transform, given in parent coordinates;
        const ChVector<Real>&
            origin,  ///< location of local frame with respect to parent, expressed in parent ref frame;
        const ChMatrix33<Real>&
            alignment  ///< rotation of local frame with respect to parent, expressed in parent coords.
        ) {
        Real mx = parent.x() - origin.x();
        Real my = parent.y() - origin.y();
        Real mz = parent.z() - origin.z();
        return ChVector<Real>(alignment(0, 0) * mx + alignment(1, 0) * my + alignment(2, 0) * mz,
                              alignment(0, 1) * mx + alignment(1, 1) * my + alignment(2, 1) * mz,
                              alignment(0, 2) * mx + alignment(1, 2) * my + alignment(2, 2) * mz);
    }